

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

optional<unsigned_int> __thiscall wasm::WATParser::Lexer::takeAlign(Lexer *this)

{
  pointer pAVar1;
  int iVar2;
  optional<unsigned_int> oVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  string_view sVar7;
  undefined1 local_c0 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> result;
  Lexer subLexer;
  long local_40 [2];
  char local_30;
  
  sVar7 = next(this);
  anon_unknown_0::keyword
            ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_c0,sVar7);
  if (((result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._8_1_ == '\x01') && (5 < (ulong)local_c0)) &&
     (*(short *)(result.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                 _M_payload._M_value.span._M_len + 4) == 0x3d6e &&
      *(int *)result.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
              _M_payload._M_value.span._M_len == 0x67696c61)) {
    sVar7._M_str = (char *)(result.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                            ._M_payload._M_value.span._M_len + 6);
    local_30 = '\0';
    sVar7._M_len = (long)local_c0 - 6;
    Lexer((Lexer *)&result.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_engaged,sVar7,
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&subLexer.buffer._M_str);
    if (local_30 == '\x01') {
      local_30 = '\0';
      if ((long *)subLexer.buffer._M_str != local_40) {
        operator_delete(subLexer.buffer._M_str,local_40[0] + 1);
      }
    }
    oVar3 = takeU<unsigned_int>((Lexer *)&result.
                                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                          ._M_payload.
                                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                          ._M_engaged);
    if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
      iVar2 = Bits::popCount(oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int>._M_payload);
      if (iVar2 == 1) {
        this->pos = this->pos + (long)local_c0;
        pAVar1 = (this->annotations).
                 super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->annotations).
            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
            ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
          (this->annotations).
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
        }
        skipSpace(this);
        uVar6 = (ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0xffffff0000000000;
        uVar5 = (ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0xff00000000;
        uVar4 = (ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0xffffffff;
      }
      else {
        uVar4 = 0;
        uVar5 = 0;
        uVar6 = 0;
      }
      if (subLexer.file.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_1_ == '\x01') {
        subLexer.file.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ = 0;
        if (subLexer.annotations.
            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            (pointer)((long)&subLexer.file.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 8U)) {
          operator_delete(subLexer.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          subLexer.file.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length + 1);
        }
      }
      if (subLexer.pos != 0) {
        operator_delete((void *)subLexer.pos,
                        (long)subLexer.annotations.
                              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                              ._M_impl.super__Vector_impl_data._M_finish - subLexer.pos);
      }
      goto LAB_00b90e50;
    }
    if (subLexer.file.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ == '\x01') {
      subLexer.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ = 0;
      if (subLexer.annotations.
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          (pointer)((long)&subLexer.file.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 8U)) {
        operator_delete(subLexer.annotations.
                        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        subLexer.file.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_string_length + 1);
      }
    }
    if (subLexer.pos != 0) {
      operator_delete((void *)subLexer.pos,
                      (long)subLexer.annotations.
                            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                            ._M_impl.super__Vector_impl_data._M_finish - subLexer.pos);
    }
  }
  uVar4 = 0;
  uVar6 = 0;
  uVar5 = 0;
LAB_00b90e50:
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)(uVar4 | uVar6 | uVar5);
}

Assistant:

std::optional<uint32_t> Lexer::takeAlign() {
  if (auto result = keyword(next())) {
    if (result->span.substr(0, 6) != "align="sv) {
      return std::nullopt;
    }
    Lexer subLexer(result->span.substr(6));
    if (auto o = subLexer.takeU32()) {
      if (Bits::popCount(*o) != 1) {
        return std::nullopt;
      }
      pos += result->span.size();
      advance();
      return o;
    }
  }
  return std::nullopt;
}